

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

void capnp::compiler::parseFile(Reader statements,Builder result,ErrorReporter *errorReporter)

{
  Reader statement_00;
  Builder builder_00;
  undefined1 auVar1 [32];
  undefined8 uVar2;
  Wrapper *pWVar3;
  bool bVar4;
  byte bVar5;
  Which WVar6;
  Which WVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Parsers *pPVar11;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *other;
  size_t sVar12;
  Orphan<capnp::compiler::Declaration> *pOVar13;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar14;
  char (*in_R8) [2];
  Orphanage orphanageParam;
  Iterator IVar15;
  undefined8 in_stack_fffffffffffff990;
  size_t local_578;
  size_t i_1;
  Builder annotationsBuilder;
  size_t i;
  Builder declsBuilder;
  String local_4f8;
  StringPtr local_4e0;
  Builder local_4d0;
  Builder local_4a8;
  uint64_t local_480;
  uint64_t id;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> local_450;
  Orphan<capnp::Text> local_430;
  Orphan<capnp::compiler::LocatedInteger> local_410;
  Builder local_3f0;
  StringPtr local_3c8;
  Builder local_3b8;
  undefined1 local_390 [8];
  Builder builder;
  Maybe<capnp::Orphan<capnp::compiler::Declaration>_> local_330;
  undefined1 local_308 [8];
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> decl;
  Reader statement;
  undefined1 local_2a0 [8];
  Iterator __end2;
  undefined1 local_280 [8];
  Iterator __begin2;
  Reader *__range2;
  undefined1 local_260 [8];
  Builder fileDecl;
  Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> annotations;
  undefined1 local_208 [8];
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> decls;
  undefined1 local_1a8 [8];
  CapnpParser parser;
  ErrorReporter *errorReporter_local;
  
  decls.builder.disposer = (ArrayDisposer *)result._builder.segment;
  auVar1 = result._builder._8_32_;
  builder_00._builder._32_8_ = in_stack_fffffffffffff990;
  builder_00._builder.segment = (SegmentBuilder *)auVar1._0_8_;
  builder_00._builder.capTable = (CapTableBuilder *)auVar1._8_8_;
  builder_00._builder.data = (void *)auVar1._16_8_;
  builder_00._builder.pointers = (WirePointer *)auVar1._24_8_;
  parser.parsers.annotationDecl.wrapper = (Wrapper *)errorReporter;
  orphanageParam =
       Orphanage::getForMessageContaining<capnp::compiler::ParsedFile::Builder>(builder_00);
  CapnpParser::CapnpParser
            ((CapnpParser *)local_1a8,orphanageParam,
             (ErrorReporter *)parser.parsers.annotationDecl.wrapper);
  uVar8 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::size(&statements);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208,(ulong)uVar8);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
             &fileDecl._builder.dataSize);
  ParsedFile::Builder::getRoot((Builder *)local_260,&result);
  Declaration::Builder::setFile((Builder *)local_260);
  __begin2._8_8_ = &statements;
  IVar15 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::begin(&statements);
  __end2._8_8_ = IVar15.container;
  __begin2.container._0_4_ = IVar15.index;
  local_280 = (undefined1  [8])__end2._8_8_;
  IVar15 = List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_2a0 = (undefined1  [8])IVar15.container;
  __end2.container._0_4_ = IVar15.index;
  while (bVar4 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                               *)local_280,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                               *)local_2a0), bVar4) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
    ::operator*((Reader *)&decl.field_1.value.builder.location,
                (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                 *)local_280);
    builder._builder._32_8_ = decl.field_1.value.builder.location;
    pPVar11 = CapnpParser::getParsers((CapnpParser *)local_1a8);
    statement_00._reader.capTable = (CapTableReader *)statement._reader.segment;
    statement_00._reader.segment = (SegmentReader *)builder._builder._32_8_;
    statement_00._reader.data = statement._reader.capTable;
    statement_00._reader.pointers = (WirePointer *)statement._reader.data;
    statement_00._reader._32_8_ = statement._reader.pointers;
    statement_00._reader._40_8_ = statement._reader._32_8_;
    CapnpParser::parseStatement
              (&local_330,(CapnpParser *)local_1a8,statement_00,&pPVar11->fileLevelDecl);
    other = kj::_::readMaybe<capnp::Orphan<capnp::compiler::Declaration>>(&local_330);
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308,other);
    kj::Maybe<capnp::Orphan<capnp::compiler::Declaration>_>::~Maybe(&local_330);
    pOVar13 = kj::_::NullableValue::operator_cast_to_Orphan_((NullableValue *)local_308);
    if (pOVar13 != (Orphan<capnp::compiler::Declaration> *)0x0) {
      pOVar13 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::operator->
                          ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308)
      ;
      Orphan<capnp::compiler::Declaration>::get
                ((BuilderFor<capnp::compiler::Declaration> *)local_390,pOVar13);
      WVar6 = Declaration::Builder::which((Builder *)local_390);
      if (WVar6 == NAKED_ID) {
        Declaration::Builder::getId(&local_3b8,(Builder *)local_260);
        bVar4 = Declaration::Id::Builder::isUid(&local_3b8);
        pWVar3 = parser.parsers.annotationDecl.wrapper;
        if (bVar4) {
          uVar9 = Declaration::Builder::getStartByte((Builder *)local_390);
          uVar10 = Declaration::Builder::getEndByte((Builder *)local_390);
          kj::StringPtr::StringPtr(&local_3c8,"File can only have one ID.");
          in_R8 = (char (*) [2])local_3c8.content.size_;
          (*(code *)**(undefined8 **)pWVar3)(pWVar3,uVar9,uVar10,local_3c8.content.ptr);
        }
        else {
          Declaration::Builder::getId(&local_3f0,(Builder *)local_260);
          Declaration::Builder::disownNakedId(&local_410,(Builder *)local_390);
          Declaration::Id::Builder::adoptUid(&local_3f0,&local_410);
          Orphan<capnp::compiler::LocatedInteger>::~Orphan(&local_410);
          bVar4 = Declaration::Builder::hasDocComment((Builder *)local_390);
          if (bVar4) {
            Declaration::Builder::disownDocComment(&local_430,(Builder *)local_390);
            Declaration::Builder::adoptDocComment((Builder *)local_260,&local_430);
            Orphan<capnp::Text>::~Orphan(&local_430);
          }
        }
      }
      else if (WVar6 == NAKED_ANNOTATION) {
        Declaration::Builder::disownNakedAnnotation(&local_450,(Builder *)local_390);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>::
        add<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>> *)
                   &fileDecl._builder.dataSize,&local_450);
        Orphan<capnp::compiler::Declaration::AnnotationApplication>::~Orphan(&local_450);
      }
      else {
        pOVar13 = kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::operator*
                            ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)
                             local_308);
        pOVar13 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(pOVar13);
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
        add<capnp::Orphan<capnp::compiler::Declaration>>
                  ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)local_208,pOVar13);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> *)local_308);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                  *)local_280);
  }
  Declaration::Builder::getId((Builder *)&id,(Builder *)local_260);
  WVar7 = Declaration::Id::Builder::which((Builder *)&id);
  if (WVar7 != UID) {
    local_480 = generateRandomId();
    Declaration::Builder::getId(&local_4d0,(Builder *)local_260);
    Declaration::Id::Builder::initUid(&local_4a8,&local_4d0);
    LocatedInteger::Builder::setValue(&local_4a8,local_480);
    bVar5 = (**(code **)(*(long *)parser.parsers.annotationDecl.wrapper + 8))();
    pWVar3 = parser.parsers.annotationDecl.wrapper;
    if ((bVar5 & 1) == 0) {
      kj::hex((CappedArray<char,_17UL> *)&declsBuilder.builder.structDataSize,local_480);
      kj::str<char_const(&)[91],kj::CappedArray<char,17ul>,char_const(&)[2]>
                (&local_4f8,
                 (kj *)
                 "File does not declare an ID.  I\'ve generated one for you.  Add this line to your file: @0x"
                 ,(char (*) [91])&declsBuilder.builder.structDataSize,(CappedArray<char,_17UL> *)";"
                 ,in_R8);
      kj::StringPtr::StringPtr(&local_4e0,&local_4f8);
      (*(code *)**(undefined8 **)pWVar3)(pWVar3,0,0,local_4e0.content.ptr,local_4e0.content.size_);
      kj::String::~String(&local_4f8);
    }
  }
  sVar12 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::size
                     ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208);
  Declaration::Builder::initNestedDecls((Builder *)&i,(Builder *)local_260,(uint)sVar12);
  annotationsBuilder.builder.structDataSize = 0;
  annotationsBuilder.builder.structPointerCount = 0;
  annotationsBuilder.builder.elementSize = VOID;
  annotationsBuilder.builder._39_1_ = 0;
  for (; uVar2 = annotationsBuilder.builder._32_8_,
      sVar12 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::size
                         ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208),
      (ulong)uVar2 < sVar12;
      annotationsBuilder.builder._32_8_ = annotationsBuilder.builder._32_8_ + 1) {
    uVar8 = annotationsBuilder.builder.structDataSize;
    pOVar13 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::operator[]
                        ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208,
                         annotationsBuilder.builder._32_8_);
    pOVar13 = kj::mv<capnp::Orphan<capnp::compiler::Declaration>>(pOVar13);
    List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::adoptWithCaveats
              ((Builder *)&i,uVar8,pOVar13);
  }
  sVar12 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                     ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *
                      )&fileDecl._builder.dataSize);
  Declaration::Builder::initAnnotations((Builder *)&i_1,(Builder *)local_260,(uint)sVar12);
  for (local_578 = 0;
      sVar12 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::size
                         ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                           *)&fileDecl._builder.dataSize), local_578 < sVar12;
      local_578 = local_578 + 1) {
    pOVar14 = kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
              operator[]((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                          *)&fileDecl._builder.dataSize,local_578);
    pOVar14 = kj::mv<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>(pOVar14);
    List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Builder::
    adoptWithCaveats((Builder *)&i_1,(uint)local_578,pOVar14);
  }
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
             &fileDecl._builder.dataSize);
  kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::~Vector
            ((Vector<capnp::Orphan<capnp::compiler::Declaration>_> *)local_208);
  CapnpParser::~CapnpParser((CapnpParser *)local_1a8);
  return;
}

Assistant:

void parseFile(List<Statement>::Reader statements, ParsedFile::Builder result,
               ErrorReporter& errorReporter) {
  CapnpParser parser(Orphanage::getForMessageContaining(result), errorReporter);

  kj::Vector<Orphan<Declaration>> decls(statements.size());
  kj::Vector<Orphan<Declaration::AnnotationApplication>> annotations;

  auto fileDecl = result.getRoot();
  fileDecl.setFile(VOID);

  for (auto statement: statements) {
    KJ_IF_MAYBE(decl, parser.parseStatement(statement, parser.getParsers().fileLevelDecl)) {
      Declaration::Builder builder = decl->get();
      switch (builder.which()) {
        case Declaration::NAKED_ID:
          if (fileDecl.getId().isUid()) {
            errorReporter.addError(builder.getStartByte(), builder.getEndByte(),
                                   "File can only have one ID.");
          } else {
            fileDecl.getId().adoptUid(builder.disownNakedId());
            if (builder.hasDocComment()) {
              fileDecl.adoptDocComment(builder.disownDocComment());
            }
          }
          break;
        case Declaration::NAKED_ANNOTATION:
          annotations.add(builder.disownNakedAnnotation());
          break;
        default:
          decls.add(kj::mv(*decl));
          break;
      }
    }
  }

  if (fileDecl.getId().which() != Declaration::Id::UID) {
    // We didn't see an ID. Generate one randomly for now.
    uint64_t id = generateRandomId();
    fileDecl.getId().initUid().setValue(id);

    // Don't report missing ID if there was a parse error, because quite often the parse error
    // prevents us from parsing the ID even though it is actually there.
    if (!errorReporter.hadErrors()) {
      errorReporter.addError(0, 0,
          kj::str("File does not declare an ID.  I've generated one for you.  Add this line to "
                  "your file: @0x", kj::hex(id), ";"));
    }
  }

  auto declsBuilder = fileDecl.initNestedDecls(decls.size());
  for (size_t i = 0; i < decls.size(); i++) {
    declsBuilder.adoptWithCaveats(i, kj::mv(decls[i]));
  }

  auto annotationsBuilder = fileDecl.initAnnotations(annotations.size());
  for (size_t i = 0; i < annotations.size(); i++) {
    annotationsBuilder.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
}